

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
          (TextureCubeArrayFilteringCase *this,Context *context,char *name,char *desc,
          deUint32 minFilter,deUint32 magFilter,deUint32 wrapS,deUint32 wrapT,
          deUint32 internalFormat,int size,int depth,bool onlySampleFaceInterior)

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  bool onlySampleFaceInterior_local;
  deUint32 magFilter_local;
  deUint32 minFilter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TextureCubeArrayFilteringCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeArrayFilteringCase_011c4d90;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_internalFormat = internalFormat;
  this->m_size = size;
  this->m_depth = depth;
  this->m_onlySampleFaceInterior = onlySampleFaceInterior;
  this->m_gradientTex = (TextureCubeArray *)0x0;
  this->m_gridTex = (TextureCubeArray *)0x0;
  context_00 = Context::getRenderContext(context);
  this_00 = Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_310_ES,PRECISION_HIGHP);
  std::
  vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
  ::vector(&this->m_cases);
  this->m_caseNdx = 0;
  return;
}

Assistant:

TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase (Context& context,
															  const char* name,
															  const char* desc,
															  deUint32 minFilter,
															  deUint32 magFilter,
															  deUint32 wrapS,
															  deUint32 wrapT,
															  deUint32 internalFormat,
															  int size,
															  int depth,
															  bool onlySampleFaceInterior)
	: TestCase					(context, name, desc)
	, m_minFilter				(minFilter)
	, m_magFilter				(magFilter)
	, m_wrapS					(wrapS)
	, m_wrapT					(wrapT)
	, m_internalFormat			(internalFormat)
	, m_size					(size)
	, m_depth					(depth)
	, m_onlySampleFaceInterior	(onlySampleFaceInterior)
	, m_gradientTex				(DE_NULL)
	, m_gridTex					(DE_NULL)
	, m_renderer				(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_310_ES, glu::PRECISION_HIGHP)
	, m_caseNdx					(0)
{
}